

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_ext_free(lysf_ctx *ctx,lysp_ext *ext)

{
  lysp_ext_instance *plVar1;
  lysc_ext_instance *plVar2;
  ly_bool lVar3;
  lysp_ext_instance *plVar4;
  void *pvVar5;
  uint64_t c__;
  lysp_ext_instance *plVar6;
  uint64_t c___1;
  long lVar7;
  void *pvVar8;
  
  lydict_remove(ctx->ctx,ext->name);
  lydict_remove(ctx->ctx,ext->argname);
  lydict_remove(ctx->ctx,ext->dsc);
  lydict_remove(ctx->ctx,ext->ref);
  lVar7 = 0;
  plVar6 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar1 = ext->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      plVar4 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar4 = plVar1[-1].exts;
    }
    if (plVar4 <= plVar6) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar1->name + lVar7));
    plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
    lVar7 = lVar7 + 0x70;
  }
  if (plVar1 != (lysp_ext_instance *)0x0) {
    free(&plVar1[-1].exts);
  }
  if (ext->compiled != (lysc_ext *)0x0) {
    lVar3 = ly_set_contains(&ctx->ext_set,ext->compiled,(uint32_t *)0x0);
    if (lVar3 == '\0') {
      lVar7 = 0;
      ly_set_add(&ctx->ext_set,ext->compiled,'\0',(uint32_t *)0x0);
      pvVar8 = (void *)0x0;
      while( true ) {
        plVar2 = ext->compiled->exts;
        if (plVar2 == (lysc_ext_instance *)0x0) {
          pvVar5 = (void *)0x0;
        }
        else {
          pvVar5 = plVar2[-1].compiled;
        }
        if (pvVar5 <= pvVar8) break;
        lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar2->def + lVar7));
        pvVar8 = (void *)((long)pvVar8 + 1);
        lVar7 = lVar7 + 0x48;
      }
      if (plVar2 != (lysc_ext_instance *)0x0) {
        free(&plVar2[-1].compiled);
      }
      ext->compiled = (lysc_ext *)0x0;
    }
  }
  return;
}

Assistant:

static void
lysp_ext_free(struct lysf_ctx *ctx, struct lysp_ext *ext)
{
    lydict_remove(ctx->ctx, ext->name);
    lydict_remove(ctx->ctx, ext->argname);
    lydict_remove(ctx->ctx, ext->dsc);
    lydict_remove(ctx->ctx, ext->ref);
    FREE_ARRAY(ctx, ext->exts, lysp_ext_instance_free);
    if (ext->compiled) {
        lysc_extension_free(ctx, &ext->compiled);
    }
}